

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdRetag.cpp
# Opt level: O1

int CmdRetag(CLI *cli,Rules *rules,Database *database,Journal *journal)

{
  pointer pcVar1;
  Interval *pIVar2;
  pointer pIVar3;
  bool bVar4;
  bool bVar5;
  _Rb_tree_node_base *p_Var6;
  ostream *poVar7;
  string *__return_storage_ptr__;
  string *psVar8;
  long lVar9;
  Interval *pIVar10;
  Datetime *pDVar11;
  undefined8 *puVar12;
  iterator __end4;
  pointer pIVar13;
  byte bVar14;
  IntervalFilterFirstOf filtering_1;
  vector<Interval,_std::allocator<Interval>_> intervals;
  IntervalFilterAllWithIds filtering;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tags;
  set<int,_std::less<int>,_std::allocator<int>_> ids;
  char local_229;
  undefined1 local_228 [40];
  Database *local_200;
  vector<Interval,_std::allocator<Interval>_> local_1f8;
  undefined1 local_1e0 [36];
  uint local_1bc;
  Range *local_1b8;
  Journal *local_1b0;
  undefined **local_1a8;
  Interval *local_1a0;
  undefined1 local_198 [8];
  undefined1 auStack_190 [8];
  undefined1 local_188 [48];
  iterator local_158;
  iterator iStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  time_t local_138;
  int local_130;
  bool local_12c;
  _Alloc_hider local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_108;
  shared_ptr<IntervalFilter> local_d0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c0;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_90;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_60;
  
  bVar14 = 0;
  local_200 = database;
  local_198 = (undefined1  [8])(auStack_190 + 8);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"verbose","");
  bVar4 = Rules::getBoolean(rules,(string *)local_198,false);
  if (local_198 != (undefined1  [8])(auStack_190 + 8)) {
    operator_delete((void *)local_198,local_188._0_8_ + 1);
  }
  CLI::getIds((set<int,_std::less<int>,_std::allocator<int>_> *)&local_90,cli);
  CLI::getTags_abi_cxx11_
            ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_c0,cli);
  if (local_c0._M_impl.super__Rb_tree_header._M_node_count == 0) {
    psVar8 = (string *)__cxa_allocate_exception(0x20);
    *(string **)psVar8 = psVar8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              (psVar8,"At least one tag must be specified. See \'timew help retag\'.","");
    __cxa_throw(psVar8,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  Journal::startTransaction(journal);
  flattenDatabase(local_200,rules);
  local_1f8.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.super__Vector_impl_data.
  _M_start = (Interval *)0x0;
  local_1f8.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.super__Vector_impl_data.
  _M_finish = (Interval *)0x0;
  local_1f8.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_1b0 = journal;
  if (local_90._M_impl.super__Rb_tree_header._M_node_count == 0) {
    auStack_190 = (undefined1  [8])0x0;
    local_148._0_4_ = 0;
    local_148._4_4_ = 0;
    uStack_140._0_1_ = false;
    uStack_140._1_7_ = 0;
    local_158._M_node = (_Base_ptr)0x0;
    iStack_150._M_node = (_Base_ptr)0x0;
    local_188._32_8_ = (_Base_ptr)0x0;
    local_188._40_8_ = 0;
    local_188._16_8_ = (_Base_ptr)0x0;
    local_188._24_8_ = (_Base_ptr)0x0;
    local_188._0_8_ = 0;
    local_188._8_8_ = 0;
    local_138 = 0;
    local_198 = (undefined1  [8])&PTR__Range_001a1778;
    Datetime::Datetime((Datetime *)(local_198 + 8),0);
    Datetime::Datetime((Datetime *)(local_188 + 0x28),0);
    local_1e0._0_8_ = (pointer)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<IntervalFilterAllInRange,std::allocator<IntervalFilterAllInRange>,Range>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1e0 + 8),
               (IntervalFilterAllInRange **)local_1e0,
               (allocator<IntervalFilterAllInRange> *)&local_229,(Range *)local_198);
    local_d0.super___shared_ptr<IntervalFilter,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_1e0._0_8_;
    local_d0.super___shared_ptr<IntervalFilter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e0._8_8_;
    local_1e0._0_8_ = (pointer)0x0;
    local_1e0._8_8_ = (pointer)0x0;
    IntervalFilterFirstOf::IntervalFilterFirstOf((IntervalFilterFirstOf *)local_228,&local_d0);
    if ((Interval *)
        local_d0.super___shared_ptr<IntervalFilter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (Interval *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_d0.super___shared_ptr<IntervalFilter,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ._M_pi);
    }
    if ((pointer)local_1e0._8_8_ != (pointer)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e0._8_8_);
    }
    getTracked((vector<Interval,_std::allocator<Interval>_> *)local_198,local_200,rules,
               (IntervalFilter *)local_228);
    if (local_198 == auStack_190) {
      psVar8 = (string *)__cxa_allocate_exception(0x20);
      *(string **)psVar8 = psVar8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>(psVar8,"There is no active time tracking.","")
      ;
      __cxa_throw(psVar8,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
    }
    bVar5 = Range::is_open((Range *)local_198);
    if (!bVar5) {
      psVar8 = (string *)__cxa_allocate_exception(0x20);
      *(string **)psVar8 = psVar8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                (psVar8,"At least one ID must be specified. See \'timew help retag\'.","");
      __cxa_throw(psVar8,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
    }
    std::vector<Interval,_std::allocator<Interval>_>::operator=
              (&local_1f8,(vector<Interval,_std::allocator<Interval>_> *)local_198);
    std::vector<Interval,_std::allocator<Interval>_>::~vector
              ((vector<Interval,_std::allocator<Interval>_> *)local_198);
    local_228._0_8_ = &PTR_accepts_001a1a10;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_228._24_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_228._24_8_);
    }
  }
  else {
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_Rb_tree
              (&local_60,&local_90);
    IntervalFilterAllWithIds::IntervalFilterAllWithIds
              ((IntervalFilterAllWithIds *)local_198,
               (set<int,_std::less<int>,_std::allocator<int>_> *)&local_60);
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              (&local_60);
    getTracked((vector<Interval,_std::allocator<Interval>_> *)local_1e0,local_200,rules,
               (IntervalFilter *)local_198);
    local_228._16_8_ =
         local_1f8.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_228._8_8_ =
         local_1f8.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_228._0_8_ =
         local_1f8.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_1f8.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_1e0._0_8_;
    local_1f8.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_1e0._8_8_;
    local_1f8.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_1e0._16_8_;
    local_1e0._0_8_ = (pointer)0x0;
    local_1e0._8_8_ = (pointer)0x0;
    local_1e0._16_8_ = (pointer)0x0;
    std::vector<Interval,_std::allocator<Interval>_>::~vector
              ((vector<Interval,_std::allocator<Interval>_> *)local_228);
    std::vector<Interval,_std::allocator<Interval>_>::~vector
              ((vector<Interval,_std::allocator<Interval>_> *)local_1e0);
    pIVar3 = local_1f8.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pIVar13 = local_1f8.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (((long)local_1f8.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)local_1f8.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
               super__Vector_impl_data._M_start >> 6) * -0x5555555555555555 -
        local_90._M_impl.super__Rb_tree_header._M_node_count != 0) {
      for (p_Var6 = local_90._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var6 != &local_90._M_impl.super__Rb_tree_header;
          p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
        if (pIVar13 == pIVar3) {
LAB_00148026:
          __return_storage_ptr__ = (string *)__cxa_allocate_exception(0x20);
          local_228._0_8_ = local_228 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_228,"ID \'@{1}\' does not correspond to any tracking.","");
          format<int>(__return_storage_ptr__,1,(string *)local_228,p_Var6[1]._M_color);
          __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,
                      std::__cxx11::string::~string);
        }
        bVar5 = false;
        pIVar2 = pIVar13;
        do {
          pIVar10 = pIVar2 + 1;
          if (pIVar2->id == p_Var6[1]._M_color) {
            bVar5 = true;
            break;
          }
          pIVar2 = pIVar10;
        } while (pIVar10 != pIVar3);
        if (!bVar5) goto LAB_00148026;
      }
    }
    local_198 = (undefined1  [8])&PTR_accepts_001a1980;
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
               (auStack_190 + 8));
  }
  local_1a0 = local_1f8.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
              super__Vector_impl_data._M_finish;
  if (local_1f8.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_1f8.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_1a8 = &PTR__Range_001a1778;
    local_1b8 = (Range *)&PTR__Interval_001a16e8;
    local_1bc = (uint)bVar4;
    pIVar13 = local_1f8.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      pDVar11 = &(pIVar13->super_Range).start;
      puVar12 = (undefined8 *)(local_198 + 8);
      for (lVar9 = 0xc; lVar9 != 0; lVar9 = lVar9 + -1) {
        *puVar12 = *(undefined8 *)pDVar11;
        pDVar11 = (Datetime *)((long)pDVar11 + (ulong)bVar14 * -0x10 + 8);
        puVar12 = puVar12 + (ulong)bVar14 * -2 + 1;
      }
      local_198 = (undefined1  [8])local_1b8;
      local_12c = pIVar13->synthetic;
      local_130 = pIVar13->id;
      local_128._M_p = (pointer)&local_118;
      pcVar1 = (pIVar13->annotation)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_128,pcVar1,pcVar1 + (pIVar13->annotation)._M_string_length);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_Rb_tree(&local_108,&(pIVar13->_tags)._M_t);
      Interval::clearTags((Interval *)local_198);
      for (p_Var6 = local_c0._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var6 != &local_c0._M_impl.super__Rb_tree_header;
          p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
        Interval::tag((Interval *)local_198,(string *)(p_Var6 + 1));
      }
      Database::modifyInterval(local_200,pIVar13,(Interval *)local_198,SUB41(local_1bc,0));
      if (bVar4) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Retagged @",10);
        poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,pIVar13->id);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," as ",4);
        local_1e0._0_8_ = local_1e0 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0," ","");
        joinQuotedIfNeeded<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                  ((string *)local_228,(string *)local_1e0,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_c0);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,(char *)local_228._0_8_,local_228._8_8_);
        local_229 = '\n';
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,&local_229,1);
        if ((Interval *)local_228._0_8_ != (Interval *)(local_228 + 0x10)) {
          operator_delete((void *)local_228._0_8_,(ulong)(local_228._16_8_ + 1));
        }
        if ((pointer)local_1e0._0_8_ != (pointer)(local_1e0 + 0x10)) {
          operator_delete((void *)local_1e0._0_8_,(ulong)(local_1e0._16_8_ + 1));
        }
      }
      local_198 = (undefined1  [8])local_1b8;
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&local_108);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_p != &local_118) {
        operator_delete(local_128._M_p,local_118._M_allocated_capacity + 1);
      }
      pIVar13 = pIVar13 + 1;
    } while (pIVar13 != local_1a0);
  }
  Journal::endTransaction(local_1b0);
  std::vector<Interval,_std::allocator<Interval>_>::~vector(&local_1f8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_c0);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_90);
  return 0;
}

Assistant:

int CmdRetag (
  CLI& cli,
  Rules& rules,
  Database& database,
  Journal& journal)
{
  const bool verbose = rules.getBoolean ("verbose");

  // Gather IDs and TAGs.
  std::set <int> ids = cli.getIds ();
  std::set <std::string> tags = cli.getTags ();

  if (tags.empty ())
  {
    throw std::string ("At least one tag must be specified. See 'timew help retag'.");
  }

  journal.startTransaction ();

  flattenDatabase (database, rules);
  std::vector <Interval> intervals;

  if (ids.empty ())
  {
    IntervalFilterFirstOf filtering {std::make_shared <IntervalFilterAllInRange> (Range {})};
    auto latest = getTracked (database, rules, filtering);

    if (latest.empty ())
    {
      throw std::string ("There is no active time tracking.");
    }
    else if (! latest.at (0).is_open ())
    {
      throw std::string ("At least one ID must be specified. See 'timew help retag'.");
    }

    intervals = latest;
  }
  else
  {
    auto filtering = IntervalFilterAllWithIds (ids);
    intervals = getTracked (database, rules, filtering);

    if (intervals.size () != ids.size ())
    {
      for (auto& id: ids)
      {
        bool found = false;

        for (auto& interval: intervals)
        {
          if (interval.id == id)
          {
            found = true;
            break;
          }
        }
        if (! found)
        {
          throw format ("ID '@{1}' does not correspond to any tracking.", id);
        }
      }
    }
  }

  // Remove old tags and apply new tags to intervals.
  for (const auto& interval : intervals)
  {
    Interval modified {interval};

    modified.clearTags ();

    for (auto& tag : tags)
    {
      modified.tag (tag);
    }

    database.modifyInterval (interval, modified, verbose);

    if (verbose)
    {
      std::cout << "Retagged @" << interval.id << " as " << joinQuotedIfNeeded (" ", tags) << '\n';
    }
  }

  journal.endTransaction ();

  return 0;
}